

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
::convertTo<QString>
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
           *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
  *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  QChar **in_stack_ffffffffffffffa8;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>
  *p;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QString::QString((QString *)0x14e6ec);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>_>
            ::size(p);
    (p->a).a.a.a = (QString *)0xaaaaaaaaaaaaaaaa;
    *(undefined8 *)&(p->a).a.a.b = 0xaaaaaaaaaaaaaaaa;
    (p->a).a.b = (QString *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)p,qVar3,Uninitialized);
    this_00 = QString::data_ptr((QString *)p);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_char16_t>,_const_QString_&>_>
    ::appendTo<QChar>(p,in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }